

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::LazyDescriptor::SetLazy
          (LazyDescriptor *this,string *name,FileDescriptor *file)

{
  LogMessage *pLVar1;
  Tables *pTVar2;
  string *psVar3;
  GoogleOnceDynamic *pGVar4;
  LogFinisher local_1ea;
  byte local_1e9;
  LogMessage local_1e8;
  LogFinisher local_1aa;
  byte local_1a9;
  LogMessage local_1a8;
  LogFinisher local_16a;
  byte local_169;
  LogMessage local_168;
  LogFinisher local_12a;
  byte local_129;
  LogMessage local_128;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  FileDescriptor *local_20;
  FileDescriptor *file_local;
  string *name_local;
  LazyDescriptor *this_local;
  
  local_59 = 0;
  local_20 = file;
  file_local = (FileDescriptor *)name;
  name_local = (string *)this;
  if (this->descriptor_ != (Descriptor *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa4);
    local_59 = 1;
    pLVar1 = LogMessage::operator<<(&local_58,"CHECK failed: !descriptor_: ");
    LogFinisher::operator=(local_6d,pLVar1);
  }
  if ((local_59 & 1) != 0) {
    LogMessage::~LogMessage(&local_58);
  }
  local_a9 = 0;
  if (this->file_ != (FileDescriptor *)0x0) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa5);
    local_a9 = 1;
    pLVar1 = LogMessage::operator<<(&local_a8,"CHECK failed: !file_: ");
    LogFinisher::operator=(&local_aa,pLVar1);
  }
  if ((local_a9 & 1) != 0) {
    LogMessage::~LogMessage(&local_a8);
  }
  local_e9 = 0;
  if (this->name_ != (string *)0x0) {
    LogMessage::LogMessage
              (&local_e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa6);
    local_e9 = 1;
    pLVar1 = LogMessage::operator<<(&local_e8,"CHECK failed: !name_: ");
    LogFinisher::operator=(&local_ea,pLVar1);
  }
  if ((local_e9 & 1) != 0) {
    LogMessage::~LogMessage(&local_e8);
  }
  local_129 = 0;
  if (this->once_ != (GoogleOnceDynamic *)0x0) {
    LogMessage::LogMessage
              (&local_128,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa7);
    local_129 = 1;
    pLVar1 = LogMessage::operator<<(&local_128,"CHECK failed: !once_: ");
    LogFinisher::operator=(&local_12a,pLVar1);
  }
  if ((local_129 & 1) != 0) {
    LogMessage::~LogMessage(&local_128);
  }
  local_169 = 0;
  if ((local_20 == (FileDescriptor *)0x0) || (*(long *)(local_20 + 0x10) == 0)) {
    LogMessage::LogMessage
              (&local_168,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa8);
    local_169 = 1;
    pLVar1 = LogMessage::operator<<(&local_168,"CHECK failed: file && file->pool_: ");
    LogFinisher::operator=(&local_16a,pLVar1);
  }
  if ((local_169 & 1) != 0) {
    LogMessage::~LogMessage(&local_168);
  }
  local_1a9 = 0;
  if ((*(byte *)(*(long *)(local_20 + 0x10) + 0x29) & 1) == 0) {
    LogMessage::LogMessage
              (&local_1a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aa9);
    local_1a9 = 1;
    pLVar1 = LogMessage::operator<<
                       (&local_1a8,"CHECK failed: file->pool_->lazily_build_dependencies_: ");
    LogFinisher::operator=(&local_1aa,pLVar1);
  }
  if ((local_1a9 & 1) != 0) {
    LogMessage::~LogMessage(&local_1a8);
  }
  local_1e9 = 0;
  if (((byte)local_20[0xb8] & 1) != 0) {
    LogMessage::LogMessage
              (&local_1e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x1aaa);
    local_1e9 = 1;
    pLVar1 = LogMessage::operator<<(&local_1e8,"CHECK failed: !file->finished_building_: ");
    LogFinisher::operator=(&local_1ea,pLVar1);
  }
  if ((local_1e9 & 1) != 0) {
    LogMessage::~LogMessage(&local_1e8);
  }
  this->file_ = local_20;
  pTVar2 = scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     ((scoped_ptr<google::protobuf::DescriptorPool::Tables> *)
                      (*(long *)(local_20 + 0x10) + 0x20));
  psVar3 = DescriptorPool::Tables::AllocateString(pTVar2,(string *)file_local);
  this->name_ = psVar3;
  pTVar2 = scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     ((scoped_ptr<google::protobuf::DescriptorPool::Tables> *)
                      (*(long *)(local_20 + 0x10) + 0x20));
  pGVar4 = DescriptorPool::Tables::AllocateOnceDynamic(pTVar2);
  this->once_ = pGVar4;
  return;
}

Assistant:

void LazyDescriptor::SetLazy(const string& name, const FileDescriptor* file) {
  // verify Init() has been called and Set hasn't been called yet.
  GOOGLE_CHECK(!descriptor_);
  GOOGLE_CHECK(!file_);
  GOOGLE_CHECK(!name_);
  GOOGLE_CHECK(!once_);
  GOOGLE_CHECK(file && file->pool_);
  GOOGLE_CHECK(file->pool_->lazily_build_dependencies_);
  GOOGLE_CHECK(!file->finished_building_);
  file_ = file;
  name_ = file->pool_->tables_->AllocateString(name);
  once_ = file->pool_->tables_->AllocateOnceDynamic();
}